

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::detail::ParseMaterialXValue<tinyusdz::value::color3f>
               (string *str,color3f *value,string *err)

{
  bool bVar1;
  uint8_t *binary;
  uint64_t length;
  undefined1 local_51c [8];
  color3f val;
  AsciiParser parser;
  StreamReader sr;
  string *err_local;
  color3f *value_local;
  string *str_local;
  
  binary = (uint8_t *)::std::__cxx11::string::data();
  length = ::std::__cxx11::string::size();
  StreamReader::StreamReader((StreamReader *)&parser._primspec_fun._M_invoker,binary,length,false);
  ascii::AsciiParser::AsciiParser
            ((AsciiParser *)&val.g,(StreamReader *)&parser._primspec_fun._M_invoker);
  memset(local_51c,0,0xc);
  bVar1 = ParseValue<tinyusdz::value::color3f>((AsciiParser *)&val.g,(color3f *)local_51c,err);
  if (bVar1) {
    value->r = (float)local_51c._0_4_;
    value->g = (float)local_51c._4_4_;
    value->b = val.r;
  }
  ascii::AsciiParser::~AsciiParser((AsciiParser *)&val.g);
  return bVar1;
}

Assistant:

bool ParseMaterialXValue(const std::string &str, T *value, std::string *err) {
  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  T val{};

  if (!ParseValue(parser, val, err)) {
    return false;
  }

  (*value) = val;
  return true;
}